

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O0

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  int extraout_EAX;
  uint in_ECX;
  function<void_()> *in_R8;
  update_callback *cb_local;
  uint max_retries_local;
  fifo_path *fifo_local;
  writer *this_local;
  duration_type retry_timeout_local;
  
  this->_vptr_writer = (_func_int **)&PTR__writer_001828d0;
  fifo_path::open_client_pipe((fifo_path *)&this->fd_);
  (this->retry_timeout_).__r = (rep)uis;
  this->max_retries_ = in_ECX;
  std::function<void_()>::function(&this->update_cb_,in_R8);
  return extraout_EAX;
}

Assistant:

writer::writer (fifo_path const & fifo, duration_type const retry_timeout,
                        unsigned const max_retries, update_callback cb)
                : fd_{fifo.open_client_pipe ()}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}